

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void simd::BitwiseOr(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                    uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width
                    ,uint32_t height,SIMDType simdType)

{
  uchar *puVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  long lVar10;
  byte bVar11;
  byte *pbVar12;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  long lVar13;
  byte *pbVar14;
  uchar *puVar15;
  undefined4 in_register_0000008c;
  uint uVar16;
  uint uVar17;
  uchar *puVar18;
  uchar *puVar19;
  byte *pbVar20;
  uint32_t local_b0;
  uint32_t local_ac;
  ImageTemplate<unsigned_char> *local_a8;
  uint local_9c;
  Image *local_98;
  undefined8 local_90;
  undefined8 local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_88 = CONCAT44(in_register_0000008c,startY2);
  local_90 = CONCAT44(in_register_00000014,startY1);
  local_a8 = in2;
  local_b0 = width;
  while( true ) {
    local_ac = height;
    bVar11 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                       (in1,local_a8,out);
    local_9c = 0;
    if (simdType < 4) {
      local_9c = *(uint *)(&DAT_001ddb20 + (ulong)simdType * 4);
    }
    if (simdType == cpu_function) break;
    if (local_9c <= local_b0 * bVar11) {
      local_98 = in1;
      Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
                (in1,startX1,(uint32_t)local_90,local_a8,startX2,(uint32_t)local_88,out,startXOut,
                 startYOut,local_b0,local_ac);
      local_b0 = local_b0 * bVar11;
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_58._data = (uchar *)0x0;
      local_58._type = local_a8->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)local_a8,src);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      local_80._data = (uchar *)0x0;
      local_80._type = out->_type;
      PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
      Image_Function::
      OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
                (&local_b0,&local_ac,local_98,&local_58,&local_80);
      local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
      local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
      uVar3 = in1->_rowSize;
      uVar4 = local_a8->_rowSize;
      uVar5 = out->_rowSize;
      uVar6 = (ulong)local_b0 / (ulong)local_9c;
      uVar7 = (ulong)local_b0 % (ulong)local_9c;
      uVar16 = (uint)bVar11;
      puVar19 = in1->_data + (ulong)(startX1 * uVar16) + (ulong)((int)local_90 * uVar3);
      puVar15 = local_a8->_data + (ulong)(startX2 * uVar16) + (ulong)((int)local_88 * uVar4);
      puVar18 = out->_data + (ulong)(startXOut * uVar16) + (ulong)(startYOut * uVar5);
      uVar17 = local_ac * uVar5;
      puVar1 = puVar18 + uVar17;
      uVar16 = (int)uVar6 * local_9c;
      if (simdType == sse_function) {
        if (uVar17 == 0) {
          return;
        }
        do {
          if (local_9c <= local_b0) {
            lVar13 = 0;
            do {
              lVar10 = lVar13 + 0x10;
              auVar8 = vorps_avx(*(undefined1 (*) [16])(puVar15 + lVar13),
                                 *(undefined1 (*) [16])(puVar19 + lVar10 + -0x10));
              *(undefined1 (*) [16])(puVar18 + lVar13) = auVar8;
              lVar13 = lVar13 + 0x10;
            } while (puVar19 + lVar10 != puVar19 + uVar6 * 0x10);
          }
          if (local_b0 != uVar16) {
            pbVar20 = puVar18 + uVar16;
            pbVar2 = pbVar20 + uVar7;
            pbVar14 = puVar15 + uVar16;
            pbVar12 = puVar19 + uVar16;
            do {
              *pbVar20 = *pbVar14 | *pbVar12;
              pbVar20 = pbVar20 + 1;
              pbVar12 = pbVar12 + 1;
              pbVar14 = pbVar14 + 1;
            } while (pbVar20 != pbVar2);
          }
          puVar18 = puVar18 + uVar5;
          puVar19 = puVar19 + uVar3;
          puVar15 = puVar15 + uVar4;
        } while (puVar18 != puVar1);
        return;
      }
      if (simdType != avx_function) {
        return;
      }
      if (uVar17 == 0) {
        return;
      }
      do {
        if (local_9c <= local_b0) {
          lVar13 = 0;
          do {
            lVar10 = lVar13 + 0x20;
            auVar9 = vorps_avx(*(undefined1 (*) [32])(puVar15 + lVar13),
                               *(undefined1 (*) [32])(puVar19 + lVar10 + -0x20));
            *(undefined1 (*) [32])(puVar18 + lVar13) = auVar9;
            lVar13 = lVar13 + 0x20;
          } while (puVar19 + lVar10 != puVar19 + uVar6 * 0x20);
        }
        if (local_b0 != uVar16) {
          pbVar20 = puVar18 + uVar16;
          pbVar2 = pbVar20 + uVar7;
          pbVar14 = puVar15 + uVar16;
          pbVar12 = puVar19 + uVar16;
          do {
            *pbVar20 = *pbVar14 | *pbVar12;
            pbVar20 = pbVar20 + 1;
            pbVar12 = pbVar12 + 1;
            pbVar14 = pbVar14 + 1;
          } while (pbVar20 != pbVar2);
        }
        puVar18 = puVar18 + uVar5;
        puVar19 = puVar19 + uVar3;
        puVar15 = puVar15 + uVar4;
      } while (puVar18 != puVar1);
      return;
    }
    if (simdType != avx_function) break;
    simdType = sse_function;
    height = local_ac;
  }
  Image_Function::BitwiseOr
            (in1,startX1,(uint32_t)local_90,local_a8,startX2,(uint32_t)local_88,out,startXOut,
             startYOut,local_b0,local_ac);
  return;
}

Assistant:

void BitwiseOr( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                    Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( BitwiseOr( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::BitwiseOr( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::BitwiseOr( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }